

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

int newmodel(int p,int d,int q,int P,int D,int Q,int constant,double *result,int n)

{
  double dVar1;
  long lVar2;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      if ((*(double *)((long)result + lVar2) == (double)p) &&
         (!NAN(*(double *)((long)result + lVar2)) && !NAN((double)p))) {
        dVar1 = *(double *)((long)result + lVar2 + 8);
        if ((dVar1 == (double)d) && (!NAN(dVar1) && !NAN((double)d))) {
          dVar1 = *(double *)((long)result + lVar2 + 0x10);
          if ((dVar1 == (double)q) && (!NAN(dVar1) && !NAN((double)q))) {
            dVar1 = *(double *)((long)result + lVar2 + 0x18);
            if ((dVar1 == (double)P) && (!NAN(dVar1) && !NAN((double)P))) {
              dVar1 = *(double *)((long)result + lVar2 + 0x20);
              if ((dVar1 == (double)D) && (!NAN(dVar1) && !NAN((double)D))) {
                dVar1 = *(double *)((long)result + lVar2 + 0x28);
                if ((dVar1 == (double)Q) && (!NAN(dVar1) && !NAN((double)Q))) {
                  dVar1 = *(double *)((long)result + lVar2 + 0x30);
                  if ((dVar1 == (double)constant) && (!NAN(dVar1) && !NAN((double)constant))) {
                    return 0;
                  }
                }
              }
            }
          }
        }
      }
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)n << 6 != lVar2);
  }
  return 1;
}

Assistant:

static int newmodel(int p, int d, int q, int P, int D, int Q, int constant, double *result, int n) {
	int i,iter, lresult;

	lresult = 8;

	for(i = 0; i < n;++i) {
		iter = i * lresult;
		if ((double)p == result[iter+0] && (double)d == result[iter+1] && (double)q == result[iter+2] && (double)P == result[iter+3] &&
		 (double)D == result[iter+4] && (double)Q == result[iter+5] && (double)constant == result[iter+6]) {
			return 0;
		}
	}

	return 1;
}